

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdlvideo.cpp
# Opt level: O2

void ScaleWithAspect(int *w,int *h,int Width,int Height)

{
  uint uVar1;
  undefined8 in_RAX;
  double dVar2;
  int screenRatio;
  uint local_24;
  
  local_24 = (uint)((ulong)in_RAX >> 0x20);
  uVar1 = CheckRatio(Width,Height,(int *)0x0);
  CheckRatio(*w,*h,(int *)&local_24);
  if (uVar1 < 5 && uVar1 != local_24) {
    dVar2 = (double)*w / *(double *)(&DAT_00667bf0 + (ulong)uVar1 * 8);
    if ((double)*h < dVar2) {
      dVar2 = *(double *)(&DAT_00667bf0 + (ulong)uVar1 * 8) * (double)*h;
      h = w;
    }
    *h = (int)dVar2;
  }
  return;
}

Assistant:

void ScaleWithAspect (int &w, int &h, int Width, int Height)
{
	int resRatio = CheckRatio (Width, Height);
	int screenRatio;
	CheckRatio (w, h, &screenRatio);
	if (resRatio == screenRatio)
		return;

	double yratio;
	switch(resRatio)
	{
		case 0: yratio = 4./3.; break;
		case 1: yratio = 16./9.; break;
		case 2: yratio = 16./10.; break;
		case 3: yratio = 17./10.; break;
		case 4: yratio = 5./4.; break;
		default: return;
	}
	double y = w/yratio;
	if (y > h)
		w = h*yratio;
	else
		h = y;
}